

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeGeneratedColumn(Parse *pParse,Table *pTab,Column *pCol,int regOut)

{
  ushort uVar1;
  int iVar2;
  Vdbe *p;
  ExprList *pEVar3;
  int iVar4;
  int addr;
  Op *pOVar5;
  Expr *pExpr;
  
  p = pParse->pVdbe;
  iVar2 = pParse->nErr;
  if (pParse->iSelfTab < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = sqlite3VdbeAddOp3(p,0x14,pParse->iSelfTab + -1,0,regOut);
  }
  uVar1 = pCol->iDflt;
  if ((((uVar1 == 0) || (pTab->eTabType != '\0')) ||
      (pEVar3 = (pTab->u).tab.pDfltList, pEVar3 == (ExprList *)0x0)) ||
     (pEVar3->nExpr < (int)(uint)uVar1)) {
    pExpr = (Expr *)0x0;
  }
  else {
    pExpr = pEVar3->a[uVar1 - 1].pExpr;
  }
  sqlite3ExprCodeCopy(pParse,pExpr,regOut);
  if ('A' < pCol->affinity) {
    addr = sqlite3VdbeAddOp3(p,0x60,regOut,1,0);
    sqlite3VdbeChangeP4(p,addr,&pCol->affinity,1);
  }
  if (iVar4 != 0) {
    if (p->db->mallocFailed == '\0') {
      pOVar5 = p->aOp + iVar4;
    }
    else {
      pOVar5 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar5->p2 = p->nOp;
  }
  if (iVar2 < pParse->nErr) {
    pParse->db->errByteOffset = -1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGeneratedColumn(
  Parse *pParse,     /* Parsing context */
  Table *pTab,       /* Table containing the generated column */
  Column *pCol,      /* The generated column */
  int regOut         /* Put the result in this register */
){
  int iAddr;
  Vdbe *v = pParse->pVdbe;
  int nErr = pParse->nErr;
  assert( v!=0 );
  assert( pParse->iSelfTab!=0 );
  if( pParse->iSelfTab>0 ){
    iAddr = sqlite3VdbeAddOp3(v, OP_IfNullRow, pParse->iSelfTab-1, 0, regOut);
  }else{
    iAddr = 0;
  }
  sqlite3ExprCodeCopy(pParse, sqlite3ColumnExpr(pTab,pCol), regOut);
  if( pCol->affinity>=SQLITE_AFF_TEXT ){
    sqlite3VdbeAddOp4(v, OP_Affinity, regOut, 1, 0, &pCol->affinity, 1);
  }
  if( iAddr ) sqlite3VdbeJumpHere(v, iAddr);
  if( pParse->nErr>nErr ) pParse->db->errByteOffset = -1;
}